

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimInfo.cpp
# Opt level: O2

void __thiscall OpenMD::SimInfo::removeInteractionPairs(SimInfo *this,Molecule *mol)

{
  PairList *this_00;
  PairList *this_01;
  pointer *this_02;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ForceField *pFVar5;
  Bond *pBVar6;
  Bend *pBVar7;
  Torsion *pTVar8;
  Inversion *pIVar9;
  long lVar10;
  pointer ppTVar11;
  pointer ppRVar12;
  pointer ppAVar13;
  int i;
  long lVar14;
  StuntDouble *pSVar15;
  pointer ppBVar16;
  long lVar17;
  RigidBody *pRVar18;
  PairList *pPVar19;
  PairList *pPVar20;
  pointer ppBVar21;
  pointer ppIVar22;
  long lVar23;
  pointer ppSVar24;
  set<int,_std::less<int>,_std::allocator<int>_> rigidAtoms;
  vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> atoms;
  vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> atoms_1;
  map<int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
  atomGroups;
  
  pFVar5 = this->forceField_;
  atomGroups._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &atomGroups._M_t._M_impl.super__Rb_tree_header._M_header;
  atomGroups._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  atomGroups._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  atomGroups._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  ppSVar24 = (mol->integrableObjects_).
             super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  if (ppSVar24 ==
      (mol->integrableObjects_).
      super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pSVar15 = (StuntDouble *)0x0;
  }
  else {
    pSVar15 = *ppSVar24;
  }
  this_02 = &atoms_1.super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  atomGroups._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       atomGroups._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while (pSVar15 != (StuntDouble *)0x0) {
    if (pSVar15->objType_ == otRigidBody) {
      std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::vector
                (&atoms,(vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)&pSVar15[2].mass_
                );
      rigidAtoms._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      rigidAtoms._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      rigidAtoms._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &rigidAtoms._M_t._M_impl.super__Rb_tree_header._M_header;
      rigidAtoms._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      rigidAtoms._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           rigidAtoms._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      for (lVar14 = 0;
          lVar14 < (int)((ulong)((long)atoms.
                                       super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)atoms.
                                      super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 3);
          lVar14 = lVar14 + 1) {
        atoms_1.super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
        super__Vector_impl_data._M_start._0_4_ =
             (atoms.super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
              super__Vector_impl_data._M_start[lVar14]->super_StuntDouble).globalIndex_;
        std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
        _M_insert_unique<int>(&rigidAtoms._M_t,(int *)&atoms_1);
      }
      for (lVar14 = 0;
          lVar14 < (int)((ulong)((long)atoms.
                                       super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)atoms.
                                      super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 3);
          lVar14 = lVar14 + 1) {
        atoms_1.super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
        super__Vector_impl_data._M_start._0_4_ =
             (atoms.super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
              super__Vector_impl_data._M_start[lVar14]->super_StuntDouble).globalIndex_;
        std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::_Rb_tree
                  ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
                   this_02,&rigidAtoms._M_t);
        std::
        _Rb_tree<int,std::pair<int_const,std::set<int,std::less<int>,std::allocator<int>>>,std::_Select1st<std::pair<int_const,std::set<int,std::less<int>,std::allocator<int>>>>,std::less<int>,std::allocator<std::pair<int_const,std::set<int,std::less<int>,std::allocator<int>>>>>
        ::_M_insert_unique<std::pair<int_const,std::set<int,std::less<int>,std::allocator<int>>>>
                  ((_Rb_tree<int,std::pair<int_const,std::set<int,std::less<int>,std::allocator<int>>>,std::_Select1st<std::pair<int_const,std::set<int,std::less<int>,std::allocator<int>>>>,std::less<int>,std::allocator<std::pair<int_const,std::set<int,std::less<int>,std::allocator<int>>>>>
                    *)&atomGroups,
                   (pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_> *)&atoms_1
                  );
        std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
        ~_Rb_tree((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
                  this_02);
      }
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
                (&rigidAtoms._M_t);
      std::_Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::~_Vector_base
                (&atoms.super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>);
    }
    else {
      rigidAtoms._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      rigidAtoms._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      rigidAtoms._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &rigidAtoms._M_t._M_impl.super__Rb_tree_header._M_header;
      rigidAtoms._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      atoms_1.super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ = pSVar15->globalIndex_;
      rigidAtoms._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           rigidAtoms._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
      _M_insert_unique<int>(&rigidAtoms._M_t,(int *)&atoms_1);
      atoms_1.super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ = pSVar15->globalIndex_;
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::_Rb_tree
                ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
                 &atoms_1.super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish,&rigidAtoms._M_t);
      std::
      _Rb_tree<int,std::pair<int_const,std::set<int,std::less<int>,std::allocator<int>>>,std::_Select1st<std::pair<int_const,std::set<int,std::less<int>,std::allocator<int>>>>,std::less<int>,std::allocator<std::pair<int_const,std::set<int,std::less<int>,std::allocator<int>>>>>
      ::_M_insert_unique<std::pair<int_const,std::set<int,std::less<int>,std::allocator<int>>>>
                ((_Rb_tree<int,std::pair<int_const,std::set<int,std::less<int>,std::allocator<int>>>,std::_Select1st<std::pair<int_const,std::set<int,std::less<int>,std::allocator<int>>>>,std::less<int>,std::allocator<std::pair<int_const,std::set<int,std::less<int>,std::allocator<int>>>>>
                  *)&atomGroups,
                 (pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_> *)&atoms_1);
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
                ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
                 &atoms_1.super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish);
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
                (&rigidAtoms._M_t);
    }
    ppSVar24 = ppSVar24 + 1;
    pSVar15 = (StuntDouble *)0x0;
    if (ppSVar24 !=
        (mol->integrableObjects_).
        super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pSVar15 = *ppSVar24;
    }
  }
  ppBVar16 = (mol->bonds_).super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  if (ppBVar16 ==
      (mol->bonds_).super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pBVar6 = (Bond *)0x0;
  }
  else {
    pBVar6 = *ppBVar16;
  }
  this_00 = &this->oneTwoInteractions_;
  this_01 = &this->excludedInteractions_;
  while (ppBVar16 = ppBVar16 + 1, pBVar6 != (Bond *)0x0) {
    pPVar19 = this_00;
    if (((pFVar5->forceFieldOptions_).vdw12scale.super_ParameterBase.empty_ == true) &&
       ((pFVar5->forceFieldOptions_).electrostatic12scale.super_ParameterBase.empty_ != false)) {
      pPVar19 = this_01;
    }
    ppAVar13 = (pBVar6->super_ShortRangeInteraction).atoms_.
               super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    PairList::removePair
              (pPVar19,((*ppAVar13)->super_StuntDouble).globalIndex_,
               (ppAVar13[1]->super_StuntDouble).globalIndex_);
    if (ppBVar16 ==
        (mol->bonds_).super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pBVar6 = (Bond *)0x0;
    }
    else {
      pBVar6 = *ppBVar16;
    }
  }
  ppBVar21 = (mol->bends_).super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  if (ppBVar21 ==
      (mol->bends_).super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pBVar7 = (Bend *)0x0;
  }
  else {
    pBVar7 = *ppBVar21;
  }
  pPVar19 = &this->oneThreeInteractions_;
  while (ppBVar21 = ppBVar21 + 1, pBVar7 != (Bend *)0x0) {
    ppAVar13 = (pBVar7->super_ShortRangeInteraction).atoms_.
               super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    iVar1 = ((*ppAVar13)->super_StuntDouble).globalIndex_;
    iVar2 = (ppAVar13[1]->super_StuntDouble).globalIndex_;
    iVar3 = (ppAVar13[2]->super_StuntDouble).globalIndex_;
    if (((pFVar5->forceFieldOptions_).vdw12scale.super_ParameterBase.empty_ == true) &&
       ((pFVar5->forceFieldOptions_).electrostatic12scale.super_ParameterBase.empty_ != false)) {
      PairList::removePair(this_01,iVar1,iVar2);
      pPVar20 = this_01;
    }
    else {
      PairList::removePair(this_00,iVar1,iVar2);
      pPVar20 = this_00;
    }
    PairList::removePair(pPVar20,iVar2,iVar3);
    pPVar20 = pPVar19;
    if (((pFVar5->forceFieldOptions_).vdw13scale.super_ParameterBase.empty_ == true) &&
       ((pFVar5->forceFieldOptions_).electrostatic13scale.super_ParameterBase.empty_ != false)) {
      pPVar20 = this_01;
    }
    PairList::removePair(pPVar20,iVar1,iVar3);
    if (ppBVar21 ==
        (mol->bends_).super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pBVar7 = (Bend *)0x0;
    }
    else {
      pBVar7 = *ppBVar21;
    }
  }
  ppTVar11 = (mol->torsions_).
             super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if (ppTVar11 ==
      (mol->torsions_).super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    pTVar8 = (Torsion *)0x0;
  }
  else {
    pTVar8 = *ppTVar11;
  }
  while (ppTVar11 = ppTVar11 + 1, pTVar8 != (Torsion *)0x0) {
    ppAVar13 = (pTVar8->super_ShortRangeInteraction).atoms_.
               super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    iVar1 = ((*ppAVar13)->super_StuntDouble).globalIndex_;
    iVar2 = (ppAVar13[1]->super_StuntDouble).globalIndex_;
    iVar3 = (ppAVar13[2]->super_StuntDouble).globalIndex_;
    iVar4 = (ppAVar13[3]->super_StuntDouble).globalIndex_;
    if (((pFVar5->forceFieldOptions_).vdw12scale.super_ParameterBase.empty_ == true) &&
       ((pFVar5->forceFieldOptions_).electrostatic12scale.super_ParameterBase.empty_ != false)) {
      PairList::removePair(this_01,iVar1,iVar2);
      PairList::removePair(this_01,iVar2,iVar3);
      pPVar20 = this_01;
    }
    else {
      PairList::removePair(this_00,iVar1,iVar2);
      PairList::removePair(this_00,iVar2,iVar3);
      pPVar20 = this_00;
    }
    PairList::removePair(pPVar20,iVar3,iVar4);
    if (((pFVar5->forceFieldOptions_).vdw13scale.super_ParameterBase.empty_ == true) &&
       ((pFVar5->forceFieldOptions_).electrostatic13scale.super_ParameterBase.empty_ != false)) {
      PairList::removePair(this_01,iVar1,iVar3);
      pPVar20 = this_01;
    }
    else {
      PairList::removePair(pPVar19,iVar1,iVar3);
      pPVar20 = pPVar19;
    }
    PairList::removePair(pPVar20,iVar2,iVar4);
    pPVar20 = &this->oneFourInteractions_;
    if (((pFVar5->forceFieldOptions_).vdw14scale.super_ParameterBase.empty_ == true) &&
       ((pFVar5->forceFieldOptions_).electrostatic14scale.super_ParameterBase.empty_ != false)) {
      pPVar20 = this_01;
    }
    PairList::removePair(pPVar20,iVar1,iVar4);
    if (ppTVar11 ==
        (mol->torsions_).super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      pTVar8 = (Torsion *)0x0;
    }
    else {
      pTVar8 = *ppTVar11;
    }
  }
  ppIVar22 = (mol->inversions_).
             super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if (ppIVar22 !=
      (mol->inversions_).
      super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
      super__Vector_impl_data._M_finish) goto LAB_00136fb4;
  pIVar9 = (Inversion *)0x0;
  while (pIVar9 != (Inversion *)0x0) {
    ppAVar13 = (pIVar9->super_ShortRangeInteraction).atoms_.
               super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    iVar1 = ((*ppAVar13)->super_StuntDouble).globalIndex_;
    iVar2 = (ppAVar13[1]->super_StuntDouble).globalIndex_;
    iVar3 = (ppAVar13[2]->super_StuntDouble).globalIndex_;
    iVar4 = (ppAVar13[3]->super_StuntDouble).globalIndex_;
    if (((pFVar5->forceFieldOptions_).vdw12scale.super_ParameterBase.empty_ == true) &&
       ((pFVar5->forceFieldOptions_).electrostatic12scale.super_ParameterBase.empty_ != false)) {
      PairList::removePair(this_01,iVar1,iVar2);
      PairList::removePair(this_01,iVar1,iVar3);
      pPVar20 = this_01;
    }
    else {
      PairList::removePair(this_00,iVar1,iVar2);
      PairList::removePair(this_00,iVar1,iVar3);
      pPVar20 = this_00;
    }
    PairList::removePair(pPVar20,iVar1,iVar4);
    if (((pFVar5->forceFieldOptions_).vdw13scale.super_ParameterBase.empty_ == true) &&
       ((pFVar5->forceFieldOptions_).electrostatic13scale.super_ParameterBase.empty_ != false)) {
      PairList::removePair(this_01,iVar2,iVar3);
      PairList::removePair(this_01,iVar2,iVar4);
      pPVar20 = this_01;
    }
    else {
      PairList::removePair(pPVar19,iVar2,iVar3);
      PairList::removePair(pPVar19,iVar2,iVar4);
      pPVar20 = pPVar19;
    }
    PairList::removePair(pPVar20,iVar3,iVar4);
    ppIVar22 = ppIVar22 + 1;
    pIVar9 = (Inversion *)0x0;
    if (ppIVar22 !=
        (mol->inversions_).
        super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
LAB_00136fb4:
      pIVar9 = *ppIVar22;
    }
  }
  ppRVar12 = (mol->rigidBodies_).
             super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if (ppRVar12 ==
      (mol->rigidBodies_).
      super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pRVar18 = (RigidBody *)0x0;
  }
  else {
    pRVar18 = *ppRVar12;
  }
  while (pRVar18 != (RigidBody *)0x0) {
    std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::vector(&atoms_1,&pRVar18->atoms_);
    lVar10 = CONCAT44(atoms_1.super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
                      _M_impl.super__Vector_impl_data._M_start._4_4_,
                      (int)atoms_1.
                           super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
                           _M_impl.super__Vector_impl_data._M_start);
    lVar14 = 1;
    ppAVar13 = atoms_1.super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
               super__Vector_impl_data._M_finish;
    lVar23 = 0;
    while (lVar23 < ((long)ppAVar13 - lVar10) * 0x20000000 + -0x100000000 >> 0x20) {
      for (lVar17 = lVar14; lVar17 < (int)((ulong)((long)ppAVar13 - lVar10) >> 3);
          lVar17 = lVar17 + 1) {
        PairList::removePair
                  (this_01,*(int *)(*(long *)(lVar10 + lVar23 * 8) + 0x28),
                   *(int *)(*(long *)(lVar10 + lVar17 * 8) + 0x28));
        lVar10 = CONCAT44(atoms_1.
                          super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
                          _M_impl.super__Vector_impl_data._M_start._4_4_,
                          (int)atoms_1.
                               super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
                               _M_impl.super__Vector_impl_data._M_start);
        ppAVar13 = atoms_1.super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
      }
      lVar14 = lVar14 + 1;
      lVar23 = lVar23 + 1;
    }
    std::_Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::~_Vector_base
              (&atoms_1.super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>);
    ppRVar12 = ppRVar12 + 1;
    pRVar18 = (RigidBody *)0x0;
    if (ppRVar12 !=
        (mol->rigidBodies_).
        super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pRVar18 = *ppRVar12;
    }
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
  ::~_Rb_tree(&atomGroups._M_t);
  return;
}

Assistant:

void SimInfo::removeInteractionPairs(Molecule* mol) {
    ForceFieldOptions& options_ = forceField_->getForceFieldOptions();
    vector<Bond*>::iterator bondIter;
    vector<Bend*>::iterator bendIter;
    vector<Torsion*>::iterator torsionIter;
    vector<Inversion*>::iterator inversionIter;
    Bond* bond;
    Bend* bend;
    Torsion* torsion;
    Inversion* inversion;
    int a;
    int b;
    int c;
    int d;

    map<int, set<int>> atomGroups;
    Molecule::RigidBodyIterator rbIter;
    RigidBody* rb;
    Molecule::IntegrableObjectIterator ii;
    StuntDouble* sd;

    for (sd = mol->beginIntegrableObject(ii); sd != NULL;
         sd = mol->nextIntegrableObject(ii)) {
      if (sd->isRigidBody()) {
        rb                  = static_cast<RigidBody*>(sd);
        vector<Atom*> atoms = rb->getAtoms();
        set<int> rigidAtoms;
        for (int i = 0; i < static_cast<int>(atoms.size()); ++i) {
          rigidAtoms.insert(atoms[i]->getGlobalIndex());
        }
        for (int i = 0; i < static_cast<int>(atoms.size()); ++i) {
          atomGroups.insert(map<int, set<int>>::value_type(
              atoms[i]->getGlobalIndex(), rigidAtoms));
        }
      } else {
        set<int> oneAtomSet;
        oneAtomSet.insert(sd->getGlobalIndex());
        atomGroups.insert(
            map<int, set<int>>::value_type(sd->getGlobalIndex(), oneAtomSet));
      }
    }

    for (bond = mol->beginBond(bondIter); bond != NULL;
         bond = mol->nextBond(bondIter)) {
      a = bond->getAtomA()->getGlobalIndex();
      b = bond->getAtomB()->getGlobalIndex();

      if (options_.havevdw12scale() || options_.haveelectrostatic12scale()) {
        oneTwoInteractions_.removePair(a, b);
      } else {
        excludedInteractions_.removePair(a, b);
      }
    }

    for (bend = mol->beginBend(bendIter); bend != NULL;
         bend = mol->nextBend(bendIter)) {
      a = bend->getAtomA()->getGlobalIndex();
      b = bend->getAtomB()->getGlobalIndex();
      c = bend->getAtomC()->getGlobalIndex();

      if (options_.havevdw12scale() || options_.haveelectrostatic12scale()) {
        oneTwoInteractions_.removePair(a, b);
        oneTwoInteractions_.removePair(b, c);
      } else {
        excludedInteractions_.removePair(a, b);
        excludedInteractions_.removePair(b, c);
      }

      if (options_.havevdw13scale() || options_.haveelectrostatic13scale()) {
        oneThreeInteractions_.removePair(a, c);
      } else {
        excludedInteractions_.removePair(a, c);
      }
    }

    for (torsion = mol->beginTorsion(torsionIter); torsion != NULL;
         torsion = mol->nextTorsion(torsionIter)) {
      a = torsion->getAtomA()->getGlobalIndex();
      b = torsion->getAtomB()->getGlobalIndex();
      c = torsion->getAtomC()->getGlobalIndex();
      d = torsion->getAtomD()->getGlobalIndex();

      if (options_.havevdw12scale() || options_.haveelectrostatic12scale()) {
        oneTwoInteractions_.removePair(a, b);
        oneTwoInteractions_.removePair(b, c);
        oneTwoInteractions_.removePair(c, d);
      } else {
        excludedInteractions_.removePair(a, b);
        excludedInteractions_.removePair(b, c);
        excludedInteractions_.removePair(c, d);
      }

      if (options_.havevdw13scale() || options_.haveelectrostatic13scale()) {
        oneThreeInteractions_.removePair(a, c);
        oneThreeInteractions_.removePair(b, d);
      } else {
        excludedInteractions_.removePair(a, c);
        excludedInteractions_.removePair(b, d);
      }

      if (options_.havevdw14scale() || options_.haveelectrostatic14scale()) {
        oneFourInteractions_.removePair(a, d);
      } else {
        excludedInteractions_.removePair(a, d);
      }
    }

    for (inversion = mol->beginInversion(inversionIter); inversion != NULL;
         inversion = mol->nextInversion(inversionIter)) {
      a = inversion->getAtomA()->getGlobalIndex();
      b = inversion->getAtomB()->getGlobalIndex();
      c = inversion->getAtomC()->getGlobalIndex();
      d = inversion->getAtomD()->getGlobalIndex();

      if (options_.havevdw12scale() || options_.haveelectrostatic12scale()) {
        oneTwoInteractions_.removePair(a, b);
        oneTwoInteractions_.removePair(a, c);
        oneTwoInteractions_.removePair(a, d);
      } else {
        excludedInteractions_.removePair(a, b);
        excludedInteractions_.removePair(a, c);
        excludedInteractions_.removePair(a, d);
      }

      if (options_.havevdw13scale() || options_.haveelectrostatic13scale()) {
        oneThreeInteractions_.removePair(b, c);
        oneThreeInteractions_.removePair(b, d);
        oneThreeInteractions_.removePair(c, d);
      } else {
        excludedInteractions_.removePair(b, c);
        excludedInteractions_.removePair(b, d);
        excludedInteractions_.removePair(c, d);
      }
    }

    for (rb = mol->beginRigidBody(rbIter); rb != NULL;
         rb = mol->nextRigidBody(rbIter)) {
      vector<Atom*> atoms = rb->getAtoms();
      for (int i = 0; i < static_cast<int>(atoms.size()) - 1; ++i) {
        for (int j = i + 1; j < static_cast<int>(atoms.size()); ++j) {
          a = atoms[i]->getGlobalIndex();
          b = atoms[j]->getGlobalIndex();
          excludedInteractions_.removePair(a, b);
        }
      }
    }
  }